

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

Sets * __thiscall wasm::LazyLocalGraph::getSets(LazyLocalGraph *this,LocalGet *get)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  local_20;
  iterator iter;
  LocalGet *get_local;
  LazyLocalGraph *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
               )get;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
       ::find(&this->getSetsMap,(key_type *)&iter);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
       ::end(&this->getSetsMap);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    computeGetSets(this,(LocalGet *)
                        iter.
                        super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
                        ._M_cur);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
         ::find(&this->getSetsMap,(key_type *)&iter);
    local_20._M_cur = local_30._M_cur;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
         ::end(&this->getSetsMap);
    bVar1 = std::__detail::operator!=(&local_20,&local_38);
    if (!bVar1) {
      __assert_fail("iter != getSetsMap.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xc4,"const Sets &wasm::LazyLocalGraph::getSets(LocalGet *) const");
    }
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false,_false>
                         *)&local_20);
  return &ppVar2->second;
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      computeGetSets(get);
      iter = getSetsMap.find(get);
      assert(iter != getSetsMap.end());
    }
    return iter->second;
  }